

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlogging.cpp
# Opt level: O0

QDebug __thiscall QMessageLogger::debug(QMessageLogger *this,QLoggingCategory *cat)

{
  _func_int **pp_Var1;
  bool bVar2;
  _func_int *p_Var3;
  QLoggingCategory *in_RDX;
  undefined8 in_RSI;
  Stream *in_RDI;
  QMessageLogContext *ctxt;
  QDebug *dbg;
  QMessageLogContext *in_stack_ffffffffffffff98;
  QMessageLogContext *in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  
  (in_RDI->ts)._vptr_QTextStream = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
  QDebug::QDebug((QDebug *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                 (QtMsgType)((ulong)in_RSI >> 0x20));
  bVar2 = QLoggingCategory::isDebugEnabled((QLoggingCategory *)0x241a01);
  if (!bVar2) {
    *(undefined1 *)((long)(in_RDI->ts)._vptr_QTextStream + 0x32) = 0;
  }
  pp_Var1 = (in_RDI->ts)._vptr_QTextStream;
  QMessageLogContext::copyContextFrom(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  p_Var3 = (_func_int *)QLoggingCategory::categoryName(in_RDX);
  pp_Var1[10] = p_Var3;
  return (QDebug)in_RDI;
}

Assistant:

QDebug QMessageLogger::debug(const QLoggingCategory &cat) const
{
    QDebug dbg = QDebug(QtDebugMsg);
    if (!cat.isDebugEnabled())
        dbg.stream->message_output = false;

    QMessageLogContext &ctxt = dbg.stream->context;
    ctxt.copyContextFrom(context);
    ctxt.category = cat.categoryName();

    return dbg;
}